

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O0

int wally_s2c_commitment_verify
              (uchar *sig,size_t sig_len,uchar *s2c_data,size_t s2c_data_len,uchar *s2c_opening,
              size_t s2c_opening_len,uint32_t flags)

{
  int iVar1;
  secp256k1_context *ctx_00;
  bool bVar2;
  _Bool ok;
  secp256k1_context *ctx;
  secp256k1_ecdsa_s2c_opening opening_secp;
  secp256k1_ecdsa_signature sig_secp;
  size_t s2c_opening_len_local;
  uchar *s2c_opening_local;
  size_t s2c_data_len_local;
  uchar *s2c_data_local;
  size_t sig_len_local;
  uchar *sig_local;
  
  ctx_00 = secp_ctx();
  if ((((sig == (uchar *)0x0) || (sig_len != 0x40)) || (s2c_data == (uchar *)0x0)) ||
     (((s2c_data_len != 0x20 || (s2c_opening == (uchar *)0x0)) ||
      ((s2c_opening_len != 0x21 || (flags != 1)))))) {
    sig_local._4_4_ = -2;
  }
  else if (ctx_00 == (secp256k1_context *)0x0) {
    sig_local._4_4_ = -3;
  }
  else {
    iVar1 = secp256k1_ecdsa_signature_parse_compact
                      (ctx_00,(secp256k1_ecdsa_signature *)(opening_secp.data + 0x38),sig);
    bVar2 = false;
    if (iVar1 != 0) {
      iVar1 = secp256k1_ecdsa_s2c_opening_parse
                        (ctx_00,(secp256k1_ecdsa_s2c_opening *)&ctx,s2c_opening);
      bVar2 = false;
      if (iVar1 != 0) {
        iVar1 = secp256k1_ecdsa_s2c_verify_commit
                          (ctx_00,(secp256k1_ecdsa_signature *)(opening_secp.data + 0x38),s2c_data,
                           (secp256k1_ecdsa_s2c_opening *)&ctx);
        bVar2 = iVar1 != 0;
      }
    }
    wally_clear_2(opening_secp.data + 0x38,0x40,&ctx,0x40);
    sig_local._4_4_ = -2;
    if (bVar2) {
      sig_local._4_4_ = 0;
    }
  }
  return sig_local._4_4_;
}

Assistant:

int wally_s2c_commitment_verify(const unsigned char *sig, size_t sig_len,
                                const unsigned char *s2c_data, size_t s2c_data_len,
                                const unsigned char *s2c_opening, size_t s2c_opening_len,
                                uint32_t flags)
{
    secp256k1_ecdsa_signature sig_secp;
    secp256k1_ecdsa_s2c_opening opening_secp;
    const secp256k1_context *ctx = secp_ctx();
    bool ok;

    if (!sig || sig_len != EC_SIGNATURE_LEN ||
        !s2c_data || s2c_data_len != WALLY_S2C_DATA_LEN ||
        !s2c_opening || s2c_opening_len != WALLY_S2C_OPENING_LEN ||
        flags != EC_FLAG_ECDSA)
        return WALLY_EINVAL;

    if (!ctx)
        return WALLY_ENOMEM;

    ok = secp256k1_ecdsa_signature_parse_compact(ctx, &sig_secp, sig) &&
         secp256k1_ecdsa_s2c_opening_parse(ctx, &opening_secp, s2c_opening) &&
         secp256k1_ecdsa_s2c_verify_commit(ctx, &sig_secp, s2c_data, &opening_secp);

    wally_clear_2(&sig_secp, sizeof(sig_secp), &opening_secp, sizeof(opening_secp));
    return ok ? WALLY_OK : WALLY_EINVAL;
}